

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

void __thiscall DPlayerMenu::UpdateTranslation(DPlayerMenu *this)

{
  uint32 color;
  int iVar1;
  int key;
  FPlayerColorSet *colorset;
  
  color = userinfo_t::GetColor((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
  iVar1 = userinfo_t::GetSkin((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
  key = userinfo_t::GetColorSet((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
  if (this->PlayerClass != (FPlayerClass *)0x0) {
    iVar1 = R_FindSkin(skins[iVar1].name,
                       (int)((ulong)((long)this->PlayerClass - (long)PlayerClasses.Array) >> 5));
    colorset = TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::
               CheckKey(&this->PlayerClass->Type->ColorSets,key);
    R_GetPlayerTranslation
              (color,colorset,skins + iVar1,
               translationtables[1].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[8].Ptr);
    return;
  }
  return;
}

Assistant:

void DPlayerMenu::UpdateTranslation()
{
	int PlayerColor = players[consoleplayer].userinfo.GetColor();
	int	PlayerSkin = players[consoleplayer].userinfo.GetSkin();
	int PlayerColorset = players[consoleplayer].userinfo.GetColorSet();

	if (PlayerClass != NULL)
	{
		PlayerSkin = R_FindSkin (skins[PlayerSkin].name, int(PlayerClass - &PlayerClasses[0]));
		R_GetPlayerTranslation(PlayerColor, PlayerClass->Type->GetColorSet(PlayerColorset),
			&skins[PlayerSkin], translationtables[TRANSLATION_Players][MAXPLAYERS]);
	}
}